

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j,short *data,stbi__huffman *hdc,int b)

{
  stbi__uint32 sVar1;
  ushort uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  byte bVar7;
  int iVar8;
  ushort uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  long in_FS_OFFSET;
  
  if (j->spec_end != 0) {
    *(char **)(in_FS_OFFSET + -0x68) = "Corrupt JPEG";
    return 0;
  }
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  if (j->succ_high != 0) {
    iVar8 = j->code_bits;
    if (iVar8 < 1) {
      stbi__grow_buffer_unsafe(j);
      iVar8 = j->code_bits;
      if (iVar8 < 1) {
        return 1;
      }
    }
    sVar1 = j->code_buffer;
    j->code_buffer = sVar1 * 2;
    j->code_bits = iVar8 + -1;
    if (-1 < (int)sVar1) {
      return 1;
    }
    *data = *data + (short)(1 << ((byte)j->succ_low & 0x1f));
    return 1;
  }
  data[0x38] = 0;
  data[0x39] = 0;
  data[0x3a] = 0;
  data[0x3b] = 0;
  data[0x3c] = 0;
  data[0x3d] = 0;
  data[0x3e] = 0;
  data[0x3f] = 0;
  data[0x30] = 0;
  data[0x31] = 0;
  data[0x32] = 0;
  data[0x33] = 0;
  data[0x34] = 0;
  data[0x35] = 0;
  data[0x36] = 0;
  data[0x37] = 0;
  data[0x28] = 0;
  data[0x29] = 0;
  data[0x2a] = 0;
  data[0x2b] = 0;
  data[0x2c] = 0;
  data[0x2d] = 0;
  data[0x2e] = 0;
  data[0x2f] = 0;
  data[0x20] = 0;
  data[0x21] = 0;
  data[0x22] = 0;
  data[0x23] = 0;
  data[0x24] = 0;
  data[0x25] = 0;
  data[0x26] = 0;
  data[0x27] = 0;
  data[0x18] = 0;
  data[0x19] = 0;
  data[0x1a] = 0;
  data[0x1b] = 0;
  data[0x1c] = 0;
  data[0x1d] = 0;
  data[0x1e] = 0;
  data[0x1f] = 0;
  data[0x10] = 0;
  data[0x11] = 0;
  data[0x12] = 0;
  data[0x13] = 0;
  data[0x14] = 0;
  data[0x15] = 0;
  data[0x16] = 0;
  data[0x17] = 0;
  data[8] = 0;
  data[9] = 0;
  data[10] = 0;
  data[0xb] = 0;
  data[0xc] = 0;
  data[0xd] = 0;
  data[0xe] = 0;
  data[0xf] = 0;
  data[0] = 0;
  data[1] = 0;
  data[2] = 0;
  data[3] = 0;
  data[4] = 0;
  data[5] = 0;
  data[6] = 0;
  data[7] = 0;
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar13 = j->code_buffer;
  uVar6 = (ulong)hdc->fast[uVar13 >> 0x17];
  if (uVar6 == 0xff) {
    lVar11 = 0;
    do {
      lVar10 = lVar11;
      lVar11 = lVar10 + 1;
    } while (hdc->maxcode[lVar10 + 10] <= uVar13 >> 0x10);
    iVar8 = j->code_bits;
    if (lVar11 == 8) {
      j->code_bits = iVar8 + -0x10;
      goto LAB_001bd195;
    }
    if ((iVar8 < (int)(lVar10 + 10)) ||
       (uVar12 = (uVar13 >> (0x17U - (char)lVar11 & 0x1f) & stbi__bmask[lVar10 + 10]) +
                 hdc->delta[lVar10 + 10], 0xff < uVar12)) goto LAB_001bd195;
    iVar8 = (iVar8 - (int)lVar11) + -9;
    j->code_bits = iVar8;
    j->code_buffer = uVar13 << ((byte)(lVar10 + 10) & 0x1f);
    uVar6 = (ulong)uVar12;
  }
  else {
    bVar7 = hdc->size[uVar6];
    iVar8 = j->code_bits - (uint)bVar7;
    if (j->code_bits < (int)(uint)bVar7) goto LAB_001bd195;
    j->code_buffer = uVar13 << (bVar7 & 0x1f);
    j->code_bits = iVar8;
  }
  bVar7 = hdc->values[uVar6];
  if (0xf < bVar7) goto LAB_001bd195;
  uVar13 = 0;
  if (bVar7 != 0) {
    if (iVar8 < (int)(uint)bVar7) {
      stbi__grow_buffer_unsafe(j);
      iVar8 = j->code_bits;
    }
    uVar13 = 0;
    if ((int)(uint)bVar7 <= iVar8) {
      uVar13 = j->code_buffer;
      uVar4 = uVar13 << (bVar7 & 0x1f) | uVar13 >> 0x20 - (bVar7 & 0x1f);
      uVar12 = stbi__bmask[bVar7];
      j->code_buffer = ~uVar12 & uVar4;
      j->code_bits = iVar8 - (uint)bVar7;
      iVar8 = 0;
      if (-1 < (int)uVar13) {
        iVar8 = stbi__jbias[bVar7];
      }
      uVar13 = iVar8 + (uVar4 & uVar12);
    }
  }
  uVar12 = j->img_comp[b].dc_pred;
  if (-1 < (int)(uVar12 ^ uVar13)) {
    bVar3 = (int)(uVar13 ^ 0x7fffffff) < (int)uVar12;
    if ((int)(uVar12 & uVar13) < 0) {
      bVar3 = (int)uVar12 < (int)(-0x80000000 - uVar13);
    }
    if (bVar3) goto LAB_001bd195;
  }
  iVar8 = uVar12 + uVar13;
  j->img_comp[b].dc_pred = iVar8;
  bVar7 = (byte)j->succ_low;
  uVar13 = 1 << (bVar7 & 0x1f);
  uVar2 = (ushort)uVar13;
  if (1 < (ushort)(uVar2 + 1)) {
    uVar9 = (ushort)iVar8;
    if ((short)(uVar2 ^ uVar9) < 0) {
      iVar5 = -0x8000 / ((0x10000 << (bVar7 & 0x1f)) >> 0x10);
      if ((short)uVar2 < 0) {
        if ((short)uVar9 <= iVar5) goto LAB_001bd1f4;
      }
      else if (iVar5 <= (short)uVar9) goto LAB_001bd1f4;
LAB_001bd195:
      *(char **)(in_FS_OFFSET + -0x68) = "Corrupt JPEG";
      return 0;
    }
    if ((short)(0x7fff / (uVar13 & 0xffff)) < (short)uVar9) goto LAB_001bd195;
  }
LAB_001bd1f4:
  *data = (short)(iVar8 << (bVar7 & 0x1f));
  return 1;
}

Assistant:

static int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j, short data[64], stbi__huffman *hdc, int b)
{
   int diff,dc;
   int t;
   if (j->spec_end != 0) return stbi__err("can't merge dc and ac", "Corrupt JPEG");

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);

   if (j->succ_high == 0) {
      // first scan for DC coefficient, must be first
      memset(data,0,64*sizeof(data[0])); // 0 all the ac values now
      t = stbi__jpeg_huff_decode(j, hdc);
      if (t < 0 || t > 15) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      diff = t ? stbi__extend_receive(j, t) : 0;

      if (!stbi__addints_valid(j->img_comp[b].dc_pred, diff)) return stbi__err("bad delta", "Corrupt JPEG");
      dc = j->img_comp[b].dc_pred + diff;
      j->img_comp[b].dc_pred = dc;
      if (!stbi__mul2shorts_valid(dc, 1 << j->succ_low)) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      data[0] = (short) (dc * (1 << j->succ_low));
   } else {
      // refinement scan for DC coefficient
      if (stbi__jpeg_get_bit(j))
         data[0] += (short) (1 << j->succ_low);
   }
   return 1;
}